

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Classes.cpp
# Opt level: O3

void __thiscall
chatra::Class::cumulativeInitializeForPackage
          (Class *this,IErrorReceiver *errorReceiver,StringTable *sTable,IClassFinder *classFinder,
          Node *node)

{
  MethodTable *table;
  pointer psVar1;
  Node *node_00;
  undefined8 *puVar2;
  pointer psVar3;
  undefined1 local_c0 [8];
  unordered_map<chatra::Node_*,_chatra::Node_*,_std::hash<chatra::Node_*>,_std::equal_to<chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_chatra::Node_*>_>_>
  varSyncMap;
  string local_68;
  IClassFinder *local_48;
  StringTable *local_40;
  Class *local_38;
  
  this->node = node;
  local_48 = classFinder;
  local_40 = sTable;
  local_38 = this;
  getSyncMap((unordered_map<chatra::Node_*,_chatra::Node_*,_std::hash<chatra::Node_*>,_std::equal_to<chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_chatra::Node_*>_>_>
              *)local_c0,(Class *)node,(Node *)sTable);
  psVar3 = (node->symbols).
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (node->symbols).
           super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar3 != psVar1) {
    table = &local_38->methods;
    do {
      node_00 = (psVar3->super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (node_00->type == Def) {
        if (node_00->sid == Init) {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,
                     "package-level init() cannot be defined in interactive mode","");
          varSyncMap._M_h._M_single_bucket = (__node_base_ptr)0x0;
          errorAtNode(errorReceiver,Error,node_00,&local_68,
                      (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&varSyncMap._M_h._M_single_bucket);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&varSyncMap._M_h._M_single_bucket);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_68._M_dataplus._M_p != &local_68.field_2) {
            operator_delete(local_68._M_dataplus._M_p);
          }
          puVar2 = (undefined8 *)__cxa_allocate_exception(0x10);
          *puVar2 = &PTR__exception_00243b18;
          *(undefined4 *)(puVar2 + 1) = 0x82;
          __cxa_throw(puVar2,&RuntimeException::typeinfo,std::exception::~exception);
        }
        addMethod(table,errorReceiver,local_40,local_48,node_00,(Class *)0x0);
      }
      else if (node_00->type == Var) {
        addVariables(errorReceiver,table,
                     (unordered_map<chatra::Node_*,_chatra::Node_*,_std::hash<chatra::Node_*>,_std::equal_to<chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_chatra::Node_*>_>_>
                      *)local_c0,local_38,node_00);
      }
      psVar3 = psVar3 + 1;
    } while (psVar3 != psVar1);
  }
  std::
  _Hashtable<chatra::Node_*,_std::pair<chatra::Node_*const,_chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_chatra::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Node_*>,_std::hash<chatra::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable((_Hashtable<chatra::Node_*,_std::pair<chatra::Node_*const,_chatra::Node_*>,_std::allocator<std::pair<chatra::Node_*const,_chatra::Node_*>_>,_std::__detail::_Select1st,_std::equal_to<chatra::Node_*>,_std::hash<chatra::Node_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_c0);
  return;
}

Assistant:

void Class::cumulativeInitializeForPackage(IErrorReceiver& errorReceiver, const StringTable* sTable, IClassFinder& classFinder,
		Node* node) {

	chatra_assert(node->blockNodesState == NodeState::Parsed);
	this->node = node;

	std::unordered_map<Node*, Node*> varSyncMap = getSyncMap(node);

	for (auto& n : node->symbols) {
		if (n->type == NodeType::Var)
			addVariables(errorReceiver, methods, varSyncMap, this, n.get());
		else if (n->type == NodeType::Def) {
			if (n->sid == StringId::Init) {
				errorAtNode(errorReceiver, ErrorLevel::Error, n.get(),
						"package-level init() cannot be defined in interactive mode", {});
				throw RuntimeException(StringId::ParserErrorException);
			}
			else
				addMethod(methods, errorReceiver, sTable, classFinder, n.get(), nullptr);
		}
	}
}